

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<kj::String> * __thiscall
kj::_::ExceptionOr<kj::String>::operator=
          (ExceptionOr<kj::String> *this,ExceptionOr<kj::String> *param_1)

{
  ExceptionOr<kj::String> *param_1_local;
  ExceptionOr<kj::String> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<kj::String>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;